

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O3

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  FSE_DTable *dt;
  ulong *srcBuffer;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  undefined1 *puVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  uint maxSymbolValue;
  uint tableLog;
  BIT_DStream_t bitD;
  FSE_DState_t state1;
  uint local_94 [4];
  uint local_84;
  BIT_DStream_t local_80;
  FSE_DState_t local_50;
  FSE_DState_t local_40;
  
  local_94[0] = 0xff;
  sVar6 = 0xffffffffffffffff;
  if ((((0x203 < wkspSize) &&
       (sVar5 = FSE_readNCount_bmi2((short *)workSpace,local_94,&local_84,cSrc,cSrcSize,0),
       sVar6 = sVar5, sVar5 < 0xffffffffffffff89)) &&
      (sVar6 = 0xffffffffffffffd4, local_84 <= maxLog)) &&
     (lVar14 = (long)(1 << ((byte)local_84 & 0x1f)),
     ((1L << ((byte)local_84 & 0x3f)) + lVar14 * 4 + (ulong)(local_94[0] + 1) * 2 + 0xf &
     0xfffffffffffffffc) + 0x204 <= wkspSize)) {
    dt = (FSE_DTable *)((long)workSpace + 0x200);
    sVar6 = FSE_buildDTable_internal
                      (dt,(short *)workSpace,local_94[0],local_84,
                       (void *)((lVar14 + 1) * 4 + 0x200 + (long)workSpace),
                       (wkspSize - (lVar14 * 4 + 4)) - 0x204);
    if (sVar6 < 0xffffffffffffff89) {
      srcBuffer = (ulong *)((long)cSrc + sVar5);
      sVar5 = cSrcSize - sVar5;
      puVar10 = (undefined1 *)((long)dst + (dstCapacity - 3));
      if (*(short *)((long)workSpace + 0x202) == 0) {
        sVar6 = BIT_initDStream(&local_80,srcBuffer,sVar5);
        if (sVar6 < 0xffffffffffffff89) {
          FSE_initDState(&local_40,&local_80,dt);
          FSE_initDState(&local_50,&local_80,dt);
          iVar18 = (int)local_80.start;
          puVar16 = (undefined1 *)dst;
          puVar15 = (undefined1 *)dst;
          if (local_80.bitsConsumed < 0x41) {
            do {
              puVar16 = puVar15;
              if (local_80.ptr < local_80.limitPtr) {
                if (local_80.ptr == local_80.start) break;
                bVar21 = local_80.start <=
                         (ulong *)((long)local_80.ptr - (ulong)(local_80.bitsConsumed >> 3));
                uVar9 = (int)local_80.ptr - iVar18;
                if (bVar21) {
                  uVar9 = local_80.bitsConsumed >> 3;
                }
                local_80.bitsConsumed = local_80.bitsConsumed + uVar9 * -8;
              }
              else {
                uVar9 = local_80.bitsConsumed >> 3;
                local_80.bitsConsumed = local_80.bitsConsumed & 7;
                bVar21 = true;
              }
              local_80.ptr = (char *)((long)local_80.ptr - (ulong)uVar9);
              local_80.bitContainer = *(size_t *)local_80.ptr;
              if ((puVar10 <= puVar15) || (!bVar21)) break;
              uVar17 = (ulong)*(ushort *)((long)local_40.table + local_40.state * 4);
              bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
              iVar11 = local_80.bitsConsumed + bVar1;
              uVar8 = (uint)(local_80.bitContainer >> (-(char)iVar11 & 0x3fU)) & BIT_mask[bVar1];
              *puVar15 = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
              bVar1 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
              iVar11 = iVar11 + (uint)bVar1;
              uVar13 = (ulong)*(ushort *)((long)local_50.table + local_50.state * 4);
              uVar9 = (uint)(local_80.bitContainer >> (-(char)iVar11 & 0x3fU)) & BIT_mask[bVar1];
              puVar15[1] = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
              bVar1 = *(byte *)((long)local_40.table + uVar17 * 4 + (ulong)uVar8 * 4 + 3);
              iVar11 = iVar11 + (uint)bVar1;
              local_40.state =
                   (ulong)((uint)(local_80.bitContainer >> (-(char)iVar11 & 0x3fU)) &
                          BIT_mask[bVar1]) +
                   (ulong)*(ushort *)((long)local_40.table + uVar17 * 4 + (ulong)uVar8 * 4);
              puVar15[2] = *(undefined1 *)((long)local_40.table + uVar17 * 4 + (ulong)uVar8 * 4 + 2)
              ;
              bVar1 = *(byte *)((long)local_50.table + uVar13 * 4 + (ulong)uVar9 * 4 + 3);
              local_80.bitsConsumed = iVar11 + (uint)bVar1;
              local_50.state =
                   (ulong)((uint)(local_80.bitContainer >> (-(char)local_80.bitsConsumed & 0x3fU)) &
                          BIT_mask[bVar1]) +
                   (ulong)*(ushort *)((long)local_50.table + uVar13 * 4 + (ulong)uVar9 * 4);
              puVar15[3] = *(undefined1 *)((long)local_50.table + uVar13 * 4 + (ulong)uVar9 * 4 + 2)
              ;
              puVar16 = puVar15 + 4;
              puVar15 = puVar15 + 4;
              if (0x40 < local_80.bitsConsumed) break;
            } while( true );
          }
          puVar10 = (undefined1 *)((long)dst + (dstCapacity - 2));
          sVar6 = 0xffffffffffffffba;
          if (puVar16 <= puVar10) {
            lVar14 = (long)puVar16 - (long)dst;
            puVar16 = puVar16 + 1;
            do {
              uVar3 = *(ushort *)((long)local_40.table + local_40.state * 4);
              bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
              local_80.bitsConsumed = local_80.bitsConsumed + bVar1;
              uVar17 = local_80.bitContainer >> (-(char)local_80.bitsConsumed & 0x3fU);
              uVar9 = BIT_mask[bVar1];
              puVar16[-1] = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
              if (0x40 < local_80.bitsConsumed) {
                local_40.table = (void *)((long)local_50.table + local_50.state * 4);
                lVar7 = 2;
LAB_0070c9a0:
                *puVar16 = *(undefined1 *)((long)local_40.table + 2);
                goto LAB_0070c9c9;
              }
              if (local_80.ptr < local_80.limitPtr) {
                if (local_80.ptr != local_80.start) {
                  uVar8 = (int)local_80.ptr - iVar18;
                  if (local_80.start <=
                      (ulong *)((long)local_80.ptr - (ulong)(local_80.bitsConsumed >> 3))) {
                    uVar8 = local_80.bitsConsumed >> 3;
                  }
                  local_80.bitsConsumed = local_80.bitsConsumed + uVar8 * -8;
                  goto LAB_0070c661;
                }
              }
              else {
                uVar8 = local_80.bitsConsumed >> 3;
                local_80.bitsConsumed = local_80.bitsConsumed & 7;
LAB_0070c661:
                local_80.ptr = (char *)((long)local_80.ptr - (ulong)uVar8);
                local_80.bitContainer = *(size_t *)local_80.ptr;
              }
              if (puVar10 < puVar16) {
                return 0xffffffffffffffba;
              }
              local_40.state = (ulong)((uint)uVar17 & uVar9) + (ulong)uVar3;
              uVar3 = *(ushort *)((long)local_50.table + local_50.state * 4);
              bVar1 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
              local_80.bitsConsumed = local_80.bitsConsumed + bVar1;
              uVar17 = local_80.bitContainer >> (-(char)local_80.bitsConsumed & 0x3fU);
              uVar9 = BIT_mask[bVar1];
              *puVar16 = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
              if (0x40 < local_80.bitsConsumed) {
                local_40.table = (void *)((long)local_40.table + local_40.state * 4);
                puVar16 = puVar16 + 1;
                lVar7 = 3;
                goto LAB_0070c9a0;
              }
              if (local_80.ptr < local_80.limitPtr) {
                if (local_80.ptr != local_80.start) {
                  uVar8 = (int)local_80.ptr - iVar18;
                  if (local_80.start <=
                      (ulong *)((long)local_80.ptr - (ulong)(local_80.bitsConsumed >> 3))) {
                    uVar8 = local_80.bitsConsumed >> 3;
                  }
                  local_80.bitsConsumed = local_80.bitsConsumed + uVar8 * -8;
                  goto LAB_0070c6ec;
                }
              }
              else {
                uVar8 = local_80.bitsConsumed >> 3;
                local_80.bitsConsumed = local_80.bitsConsumed & 7;
LAB_0070c6ec:
                local_80.ptr = (char *)((long)local_80.ptr - (ulong)uVar8);
                local_80.bitContainer = *(size_t *)local_80.ptr;
              }
              local_50.state = (ulong)((uint)uVar17 & uVar9) + (ulong)uVar3;
              lVar14 = lVar14 + 2;
              puVar15 = puVar16 + 1;
              puVar16 = puVar16 + 2;
            } while (puVar15 <= puVar10);
          }
        }
      }
      else if (sVar5 == 0) {
        sVar6 = 0xffffffffffffffb8;
      }
      else {
        local_80.limitPtr = (char *)(srcBuffer + 1);
        if (sVar5 < 8) {
          local_80.bitContainer = (size_t)(byte)*srcBuffer;
          switch(sVar5) {
          case 7:
            local_80.bitContainer =
                 local_80.bitContainer | (ulong)*(byte *)((long)srcBuffer + 6) << 0x30;
          case 6:
            local_80.bitContainer =
                 local_80.bitContainer + ((ulong)*(byte *)((long)srcBuffer + 5) << 0x28);
          case 5:
            local_80.bitContainer =
                 local_80.bitContainer + ((ulong)*(byte *)((long)srcBuffer + 4) << 0x20);
          case 4:
            local_80.bitContainer =
                 local_80.bitContainer + (ulong)*(byte *)((long)srcBuffer + 3) * 0x1000000;
          case 3:
            local_80.bitContainer =
                 local_80.bitContainer + (ulong)*(byte *)((long)srcBuffer + 2) * 0x10000;
          case 2:
            local_80.bitContainer =
                 (ulong)*(byte *)((long)srcBuffer + 1) * 0x100 + local_80.bitContainer;
          }
          bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
          if (bVar1 == 0) {
            return 0xffffffffffffffec;
          }
          uVar9 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          local_80.bitsConsumed = (uVar9 ^ 0x1f) + (int)sVar5 * -8 + 0x29;
          local_80.ptr = (char *)srcBuffer;
        }
        else {
          local_80.ptr = (char *)((long)cSrc + (cSrcSize - 8));
          local_80.bitContainer = *(size_t *)local_80.ptr;
          if (local_80.bitContainer >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar9 = 0x1f;
          bVar1 = (byte)(local_80.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          local_80.bitsConsumed = ~uVar9 + 9;
          if (0xffffffffffffff88 < sVar5) {
            return sVar5;
          }
        }
        local_80.start = (char *)srcBuffer;
        FSE_initDState(&local_40,&local_80,dt);
        FSE_initDState(&local_50,&local_80,dt);
        iVar18 = (int)local_80.start;
        puVar16 = (undefined1 *)dst;
        puVar15 = (undefined1 *)dst;
        if (local_80.bitsConsumed < 0x41) {
          do {
            puVar16 = puVar15;
            if (local_80.ptr < local_80.limitPtr) {
              if (local_80.ptr == local_80.start) break;
              bVar21 = local_80.start <=
                       (ulong *)((long)local_80.ptr - (ulong)(local_80.bitsConsumed >> 3));
              uVar9 = (int)local_80.ptr - iVar18;
              if (bVar21) {
                uVar9 = local_80.bitsConsumed >> 3;
              }
              local_80.bitsConsumed = local_80.bitsConsumed + uVar9 * -8;
            }
            else {
              uVar9 = local_80.bitsConsumed >> 3;
              local_80.bitsConsumed = local_80.bitsConsumed & 7;
              bVar21 = true;
            }
            local_80.ptr = (char *)((long)local_80.ptr - (ulong)uVar9);
            local_80.bitContainer = *(size_t *)local_80.ptr;
            if ((puVar10 <= puVar15) || (!bVar21)) break;
            uVar17 = (ulong)*(ushort *)((long)local_40.table + local_40.state * 4);
            bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
            iVar11 = local_80.bitsConsumed + bVar1;
            uVar13 = (local_80.bitContainer << ((byte)local_80.bitsConsumed & 0x3f)) >>
                     (-bVar1 & 0x3f);
            *puVar15 = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
            uVar19 = (ulong)*(ushort *)((long)local_50.table + local_50.state * 4);
            bVar1 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
            iVar12 = iVar11 + (uint)bVar1;
            uVar20 = (local_80.bitContainer << ((byte)iVar11 & 0x3f)) >> (-bVar1 & 0x3f);
            puVar15[1] = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
            bVar1 = *(byte *)((long)local_40.table + uVar17 * 4 + uVar13 * 4 + 3);
            iVar11 = iVar12 + (uint)bVar1;
            local_40.state =
                 ((local_80.bitContainer << ((byte)iVar12 & 0x3f)) >> (-bVar1 & 0x3f)) +
                 (ulong)*(ushort *)((long)local_40.table + uVar17 * 4 + uVar13 * 4);
            puVar15[2] = *(undefined1 *)((long)local_40.table + uVar17 * 4 + uVar13 * 4 + 2);
            bVar1 = *(byte *)((long)local_50.table + uVar19 * 4 + uVar20 * 4 + 3);
            local_80.bitsConsumed = iVar11 + (uint)bVar1;
            local_50.state =
                 ((local_80.bitContainer << ((byte)iVar11 & 0x3f)) >> (-bVar1 & 0x3f)) +
                 (ulong)*(ushort *)((long)local_50.table + uVar19 * 4 + uVar20 * 4);
            puVar15[3] = *(undefined1 *)((long)local_50.table + uVar19 * 4 + uVar20 * 4 + 2);
            puVar16 = puVar15 + 4;
            puVar15 = puVar15 + 4;
            if (0x40 < local_80.bitsConsumed) break;
          } while( true );
        }
        puVar10 = (undefined1 *)((long)dst + (dstCapacity - 2));
        sVar6 = 0xffffffffffffffba;
        if (puVar16 <= puVar10) {
          lVar14 = (long)puVar16 - (long)dst;
          puVar16 = puVar16 + 1;
          do {
            uVar3 = *(ushort *)((long)local_40.table + local_40.state * 4);
            bVar1 = *(byte *)((long)local_40.table + local_40.state * 4 + 3);
            uVar17 = local_80.bitContainer << ((byte)local_80.bitsConsumed & 0x3f);
            local_80.bitsConsumed = local_80.bitsConsumed + bVar1;
            puVar16[-1] = *(undefined1 *)((long)local_40.table + local_40.state * 4 + 2);
            if (0x40 < local_80.bitsConsumed) {
              local_40.table = (void *)((long)local_50.table + local_50.state * 4);
              lVar7 = 2;
              goto LAB_0070c9c5;
            }
            if (local_80.ptr < local_80.limitPtr) {
              if (local_80.ptr != local_80.start) {
                uVar9 = (int)local_80.ptr - iVar18;
                if (local_80.start <=
                    (ulong *)((long)local_80.ptr - (ulong)(local_80.bitsConsumed >> 3))) {
                  uVar9 = local_80.bitsConsumed >> 3;
                }
                local_80.bitsConsumed = local_80.bitsConsumed + uVar9 * -8;
                goto LAB_0070c8b6;
              }
            }
            else {
              uVar9 = local_80.bitsConsumed >> 3;
              local_80.bitsConsumed = local_80.bitsConsumed & 7;
LAB_0070c8b6:
              local_80.ptr = (char *)((long)local_80.ptr - (ulong)uVar9);
              local_80.bitContainer = *(size_t *)local_80.ptr;
            }
            if (puVar10 < puVar16) {
              return 0xffffffffffffffba;
            }
            uVar4 = *(ushort *)((long)local_50.table + local_50.state * 4);
            bVar2 = *(byte *)((long)local_50.table + local_50.state * 4 + 3);
            uVar13 = local_80.bitContainer << ((byte)local_80.bitsConsumed & 0x3f);
            local_80.bitsConsumed = local_80.bitsConsumed + bVar2;
            local_40.state = (uVar17 >> (-bVar1 & 0x3f)) + (ulong)uVar3;
            *puVar16 = *(undefined1 *)((long)local_50.table + local_50.state * 4 + 2);
            if (0x40 < local_80.bitsConsumed) {
              local_40.table = (void *)((long)local_40.table + local_40.state * 4);
              puVar16 = puVar16 + 1;
              lVar7 = 3;
LAB_0070c9c5:
              *puVar16 = *(undefined1 *)((long)local_40.table + 2);
LAB_0070c9c9:
              return lVar7 + lVar14;
            }
            if (local_80.ptr < local_80.limitPtr) {
              if (local_80.ptr != local_80.start) {
                uVar9 = (int)local_80.ptr - iVar18;
                if (local_80.start <=
                    (ulong *)((long)local_80.ptr - (ulong)(local_80.bitsConsumed >> 3))) {
                  uVar9 = local_80.bitsConsumed >> 3;
                }
                local_80.bitsConsumed = local_80.bitsConsumed + uVar9 * -8;
                goto LAB_0070c943;
              }
            }
            else {
              uVar9 = local_80.bitsConsumed >> 3;
              local_80.bitsConsumed = local_80.bitsConsumed & 7;
LAB_0070c943:
              local_80.ptr = (char *)((long)local_80.ptr - (ulong)uVar9);
              local_80.bitContainer = *(size_t *)local_80.ptr;
            }
            local_50.state = (uVar13 >> (-bVar2 & 0x3f)) + (ulong)uVar4;
            lVar14 = lVar14 + 2;
            puVar15 = puVar16 + 1;
            puVar16 = puVar16 + 2;
          } while (puVar15 <= puVar10);
        }
      }
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}